

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanCharRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  uint local_38;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (ptr != end) {
    if ((ptr[1] == '\0') && (*ptr == 'x')) {
      iVar1 = little2_scanHexCharRef(enc,ptr + 2,end,nextTokPtr);
      return iVar1;
    }
    if (ptr[1] == '\0') {
      local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    }
    else {
      local_34 = unicode_byte_type(ptr[1],*ptr);
    }
    if (local_34 != 0x19) {
      *nextTokPtr = ptr;
      return 0;
    }
    for (end_local = ptr + 2; end_local != end; end_local = end_local + 2) {
      if (end_local[1] == '\0') {
        local_38 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
      }
      else {
        local_38 = unicode_byte_type(end_local[1],*end_local);
      }
      if (local_38 == 0x12) {
        *nextTokPtr = end_local + 2;
        return 10;
      }
      if (local_38 != 0x19) {
        *nextTokPtr = end_local;
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static
int PREFIX(scanCharRef)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (CHAR_MATCHES(enc, ptr, ASCII_x))
      return PREFIX(scanHexCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    for (ptr += MINBPC(enc); ptr != end; ptr += MINBPC(enc)) {
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_DIGIT:
        break;
      case BT_SEMI:
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_CHAR_REF;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
    }
  }
  return XML_TOK_PARTIAL;
}